

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

int Acb_ObjToGia2(Gia_Man_t *pNew,int fUseBuf,Acb_Ntk_t *p,int iObj,Vec_Int_t *vTemp,int fUseXors)

{
  byte bVar1;
  int iVar2;
  uint iLit1;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char *__assertion;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= iObj) {
LAB_003adafa:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if (0xfd < (byte)((p->vObjType).pArray[(uint)iObj] - 5U)) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                  ,0x283,"int Acb_ObjToGia2(Gia_Man_t *, int, Acb_Ntk_t *, int, Vec_Int_t *, int)");
  }
  vTemp->nSize = 0;
  if ((p->vObjFans).nSize <= iObj) goto LAB_003ada37;
  iVar2 = (p->vObjFans).pArray[(uint)iObj];
  lVar15 = (long)iVar2;
  if ((lVar15 < 0) || ((p->vFanSto).nSize <= iVar2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar3 = (p->vFanSto).pArray;
  if (0 < piVar3[lVar15]) {
    lVar14 = 0;
    do {
      iVar2 = piVar3[lVar15 + lVar14 + 1];
      if ((long)iVar2 < 1) {
        __assertion = "i>0";
LAB_003ada85:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
      }
      iVar6 = (p->vObjCopy).nSize;
      if (iVar6 < 1) {
        __assertion = "Acb_NtkHasObjCopies(p)";
        goto LAB_003ada85;
      }
      if (iVar6 <= iVar2) goto LAB_003ada37;
      iVar2 = (p->vObjCopy).pArray[iVar2];
      if (iVar2 < 0) {
        __assert_fail("Acb_ObjCopy(p, iFanin) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                      ,0x287,
                      "int Acb_ObjToGia2(Gia_Man_t *, int, Acb_Ntk_t *, int, Vec_Int_t *, int)");
      }
      lVar14 = lVar14 + 1;
      Vec_IntPush(vTemp,iVar2);
    } while (lVar14 < piVar3[lVar15]);
  }
  if ((p->vObjType).nSize <= iObj) goto LAB_003adafa;
  bVar1 = (p->vObjType).pArray[(uint)iObj];
  if (bVar1 == 7) {
    uVar5 = 0;
  }
  else if (bVar1 == 8) {
    uVar5 = 1;
  }
  else {
    if (bVar1 - 0xb < 2) {
      if (fUseBuf == 0) {
        if (vTemp->nSize < 1) goto LAB_003ada37;
        uVar5 = *vTemp->pArray;
      }
      else {
        if (vTemp->nSize < 1) {
LAB_003ada37:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar5 = *vTemp->pArray;
        pGVar7 = Gia_ManAppendObj(pNew);
        if ((int)uVar5 < 0) {
LAB_003adbd3:
          __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x30b,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
        }
        if (pNew->nObjs <= (int)(uVar5 >> 1)) goto LAB_003adbd3;
        pGVar4 = pNew->pObjs;
        if ((pGVar7 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar7)) {
LAB_003adabc:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar10 = (ulong)(((uint)((int)pGVar7 - (int)pGVar4) >> 2) * -0x55555555 - (uVar5 >> 1) &
                        0x1fffffff);
        *(ulong *)pGVar7 =
             (ulong)((uVar5 & 1) << 0x1d) |
             (ulong)(uVar5 & 1) << 0x3d | *(ulong *)pGVar7 & 0xc0000000c0000000 | uVar10 << 0x20 |
             uVar10;
        pNew->nBufs = pNew->nBufs + 1;
        pGVar4 = pNew->pObjs;
        if ((pGVar7 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar7)) goto LAB_003adabc;
        uVar5 = (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
      }
      if ((int)uVar5 < 0) {
LAB_003adb95:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      bVar17 = bVar1 == 0xc;
    }
    else if (bVar1 - 0xd < 2) {
      if (vTemp->nSize < 1) {
        uVar5 = 1;
      }
      else {
        uVar5 = 1;
        lVar15 = 0;
        do {
          uVar5 = Gia_ManAppendAnd2(pNew,uVar5,vTemp->pArray[lVar15]);
          lVar15 = lVar15 + 1;
        } while (lVar15 < vTemp->nSize);
      }
      if ((int)uVar5 < 0) goto LAB_003adb95;
      bVar17 = bVar1 == 0xe;
    }
    else if (bVar1 - 0xf < 2) {
      if (vTemp->nSize < 1) {
        uVar5 = 0;
      }
      else {
        uVar5 = 1;
        lVar15 = 0;
        do {
          if ((vTemp->pArray[lVar15] < 0) ||
             (uVar5 = Gia_ManAppendAnd2(pNew,uVar5,vTemp->pArray[lVar15] ^ 1), (int)uVar5 < 0)) {
LAB_003ada9d:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < vTemp->nSize);
        uVar5 = uVar5 ^ 1;
      }
      if ((int)uVar5 < 0) goto LAB_003adb95;
      bVar17 = bVar1 == 0x10;
    }
    else {
      if (1 < bVar1 - 0x11) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                      ,0x2a9,
                      "int Acb_ObjToGia2(Gia_Man_t *, int, Acb_Ntk_t *, int, Vec_Int_t *, int)");
      }
      if (vTemp->nSize < 1) {
        uVar5 = 0;
      }
      else {
        lVar15 = 0;
        uVar5 = 0;
        do {
          iLit1 = vTemp->pArray[lVar15];
          if (fUseXors == 0) {
            if (((int)iLit1 < 0) || ((int)uVar5 < 0)) goto LAB_003ada9d;
            uVar9 = Gia_ManAppendAnd2(pNew,uVar5 ^ 1,iLit1);
            uVar5 = Gia_ManAppendAnd2(pNew,uVar5,iLit1 ^ 1);
            if (((int)uVar9 < 0) || ((int)uVar5 < 0)) goto LAB_003ada9d;
            uVar5 = Gia_ManAppendAnd2(pNew,uVar9 ^ 1,uVar5 ^ 1);
            if ((int)uVar5 < 0) goto LAB_003adb95;
            uVar9 = uVar5 ^ 1;
          }
          else if (pNew->fGiaSimple == 0) {
            if ((int)uVar5 < 2) {
              uVar9 = iLit1;
              if (uVar5 != 0) {
                if ((int)iLit1 < 0) goto LAB_003ada9d;
                uVar9 = iLit1 ^ 1;
              }
            }
            else if ((int)iLit1 < 2) {
              uVar9 = uVar5 ^ iLit1 != 0;
            }
            else {
              uVar9 = 0;
              if ((uVar5 != iLit1) && (uVar9 = 1, (iLit1 ^ uVar5) != 1)) goto LAB_003ad73b;
            }
          }
          else {
LAB_003ad73b:
            pGVar7 = Gia_ManAppendObj(pNew);
            if ((int)uVar5 < 0) {
LAB_003adb57:
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2d4,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            uVar9 = uVar5 >> 1;
            iVar2 = pNew->nObjs;
            if (iVar2 <= (int)uVar9) goto LAB_003adb57;
            if (((int)iLit1 < 0) || (uVar8 = iLit1 >> 1, iVar2 <= (int)uVar8)) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            if (uVar9 == uVar8) {
              __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            iVar6 = (int)pGVar7;
            if (uVar8 < uVar9) {
              pGVar4 = pNew->pObjs;
              if ((pGVar7 < pGVar4) || (pGVar4 + iVar2 <= pGVar7)) goto LAB_003adabc;
              uVar10 = *(ulong *)pGVar7;
              uVar12 = (ulong)((uVar5 & 1) << 0x1d |
                              ((uint)(iVar6 - (int)pGVar4) >> 2) * -0x55555555 - uVar9 & 0x1fffffff)
              ;
              *(ulong *)pGVar7 = uVar12 | uVar10 & 0xffffffffc0000000;
              pGVar4 = pNew->pObjs;
              if ((pGVar7 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar7)) goto LAB_003adabc;
              uVar11 = (ulong)(((uint)(iVar6 - (int)pGVar4) >> 2) * -0x55555555 - uVar8 & 0x1fffffff
                              ) << 0x20;
              *(ulong *)pGVar7 = uVar12 | uVar10 & 0xe0000000c0000000 | uVar11;
              uVar13 = (ulong)(iLit1 & 1) << 0x3d;
              uVar11 = uVar12 | uVar10 & 0xc0000000c0000000 | uVar11;
            }
            else {
              pGVar4 = pNew->pObjs;
              if ((pGVar7 < pGVar4) || (pGVar4 + iVar2 <= pGVar7)) goto LAB_003adabc;
              uVar12 = (ulong)(((uint)(iVar6 - (int)pGVar4) >> 2) * -0x55555555 - uVar9 & 0x1fffffff
                              ) << 0x20;
              uVar10 = *(ulong *)pGVar7;
              uVar16 = (ulong)(uVar5 & 1) << 0x3d;
              *(ulong *)pGVar7 = uVar16 | uVar10 & 0xc0000000ffffffff | uVar12;
              pGVar4 = pNew->pObjs;
              if ((pGVar7 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar7)) goto LAB_003adabc;
              uVar11 = (ulong)(((uint)(iVar6 - (int)pGVar4) >> 2) * -0x55555555 - uVar8 & 0x1fffffff
                              );
              *(ulong *)pGVar7 = uVar16 | uVar10 & 0xc0000000e0000000 | uVar12 | uVar11;
              uVar13 = (ulong)((iLit1 & 1) << 0x1d);
              uVar11 = uVar16 | uVar10 & 0xc0000000c0000000 | uVar12 | uVar11;
            }
            *(ulong *)pGVar7 = uVar11 | uVar13;
            pNew->nXors = pNew->nXors + 1;
            pGVar4 = pNew->pObjs;
            if ((pGVar7 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar7)) goto LAB_003adabc;
            uVar9 = (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
          }
          uVar5 = uVar9;
          lVar15 = lVar15 + 1;
        } while (lVar15 < vTemp->nSize);
      }
      if ((int)uVar5 < 0) goto LAB_003adb95;
      bVar17 = bVar1 == 0x12;
    }
    uVar5 = uVar5 ^ bVar17;
  }
  return uVar5;
}

Assistant:

int Acb_ObjToGia2( Gia_Man_t * pNew, int fUseBuf, Acb_Ntk_t * p, int iObj, Vec_Int_t * vTemp, int fUseXors )
{
    //char * pName = Abc_NamStr( p->pDesign->pStrs, Acb_ObjName(p, iObj) );
    int * pFanin, iFanin, k, Type, Res;
    assert( !Acb_ObjIsCio(p, iObj) );
    Vec_IntClear( vTemp );
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
    {
        assert( Acb_ObjCopy(p, iFanin) >= 0 );
        Vec_IntPush( vTemp, Acb_ObjCopy(p, iFanin) );
    }
    Type = Acb_ObjType( p, iObj );
    if ( Type == ABC_OPER_CONST_F ) 
        return 0;
    if ( Type == ABC_OPER_CONST_T ) 
        return 1;
    if ( Type == ABC_OPER_BIT_BUF || Type == ABC_OPER_BIT_INV ) 
    {
        Res = fUseBuf ? Gia_ManAppendBuf(pNew, Vec_IntEntry(vTemp, 0)) : Vec_IntEntry(vTemp, 0);
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_INV );
    }
    if ( Type == ABC_OPER_BIT_AND || Type == ABC_OPER_BIT_NAND )
    {
        Res = 1;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManAppendAnd2( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NAND );
    }
    if ( Type == ABC_OPER_BIT_OR || Type == ABC_OPER_BIT_NOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManAppendOr2( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NOR );
    }
    if ( Type == ABC_OPER_BIT_XOR || Type == ABC_OPER_BIT_NXOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = fUseXors ? Gia_ManAppendXorReal2(pNew, Res, iFanin) : Gia_ManAppendXor2(pNew, Res, iFanin);
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NXOR );
    }
    assert( 0 );
    return -1;
}